

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O2

void __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator
          (Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *cpx,
          Static_vertex_vector *simp)

{
  reference piVar1;
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
  iVar2;
  runtime_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>
  *in_R8;
  list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>
  local_258;
  undefined1 local_250 [8];
  undefined1 local_248 [16];
  type local_238;
  is_coface local_178;
  is_coface local_c8;
  
  (this->predicate_).cpx_ = cpx;
  boost::container::
  vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::vector
            (&(this->predicate_).simp_.
              super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             ,&simp->
               super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
            );
  this->st_ = cpx;
  (this->it_).super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->it_).m_predicate.cpx_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  (this->it_).m_predicate.simp_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = 0;
  (this->it_).m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).m_predicate.cpx_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)0x0;
  (this->end_).m_predicate.simp_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = 0;
  (this->end_).m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  if ((simp->
      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
      ).m_holder.m_size == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"cannot call for cofaces of an empty simplex");
    puVar4 = &std::invalid_argument::typeinfo;
    pcVar3 = std::invalid_argument::~invalid_argument;
  }
  else {
    piVar1 = boost::container::
             vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             ::front(&simp->
                      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                    );
    iVar2.nodeptr_ =
         (list_node<void_*> *)
         Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::nodes_by_label(cpx,*piVar1);
    if (iVar2.nodeptr_ != (list_node<void_*> *)0x0) {
      is_coface::is_coface(&local_c8,&this->predicate_);
      local_248._8_8_ =
           (((type *)&(iVar2.nodeptr_)->next_)->data_).root_plus_size_.m_header.super_node.next_;
      local_248._0_8_ = iVar2.nodeptr_;
      boost::iterators::
      make_filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>::is_coface,boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>,&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,true>>
                ((filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
                  *)&local_238.aligner,(iterators *)&local_c8,(is_coface *)(local_248 + 8),
                 (list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>
                  *)local_248,in_R8);
      boost::iterators::
      filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
      ::operator=(&this->it_,
                  (filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
                   *)&local_238.aligner);
      is_coface::is_coface(&local_178,&this->predicate_);
      local_258.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
            )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
              )iVar2.nodeptr_;
      local_250 = (undefined1  [8])iVar2.nodeptr_;
      boost::iterators::
      make_filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>::is_coface,boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>,&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,true>>
                ((filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
                  *)&local_238.aligner,(iterators *)&local_178,(is_coface *)local_250,&local_258,
                 in_R8);
      boost::iterators::
      filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
      ::operator=(&this->end_,
                  (filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
                   *)&local_238.aligner);
      Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::simplex_handle_from_node
                ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)&local_238.aligner,
                 (Node *)((this->it_).super_type.m_iterator.members_.nodeptr_ + -1));
      (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)local_238._0_8_;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid call to cofaces forest");
    puVar4 = &std::runtime_error::typeinfo;
    pcVar3 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar4,pcVar3);
}

Assistant:

Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator(SimplexTree const* cpx,
                                                                  Static_vertex_vector&& simp)
      : predicate_(cpx, std::move(simp)), st_(cpx) {
    GUDHI_CHECK(!simp.empty(), std::invalid_argument("cannot call for cofaces of an empty simplex"));
    const auto list_ptr = st_->nodes_by_label(simp.front());
    GUDHI_CHECK(list_ptr != nullptr, std::runtime_error("invalid call to cofaces forest"));

    it_ = boost::make_filter_iterator(predicate_, list_ptr->begin(), list_ptr->end());
    end_ = boost::make_filter_iterator(predicate_, list_ptr->end(), list_ptr->end());
    const Node& curr_node = static_cast<const Node&>(*it_);
    sh_ = st_->simplex_handle_from_node(curr_node);
  }